

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_METAL_MOVA(Context *ctx)

{
  uint writemask;
  size_t in_R8;
  uint uVar1;
  char src0 [64];
  char code [128];
  
  writemask = (ctx->dest_arg).writemask;
  uVar1 = (writemask >> 2 & 1) + (writemask & 1) + (uint)((writemask >> 1 & 1) != 0) +
          (uint)((writemask >> 3 & 1) != 0);
  make_METAL_srcarg_string(ctx,0,writemask,src0,in_R8);
  ctx->metal_need_header_common = 1;
  ctx->metal_need_header_math = 1;
  if (uVar1 == 1) {
    make_METAL_destarg_assign(ctx,code,0x80,"int(floor(abs(%s) + 0.5) * sign(%s))",src0,src0);
  }
  else {
    make_METAL_destarg_assign
              (ctx,code,0x80,"int%d(floor(abs(%s) + float%d(0.5)) * sign(%s))",(ulong)uVar1,src0,
               (ulong)uVar1,src0);
  }
  output_line(ctx,"%s",code);
  return;
}

Assistant:

static void emit_METAL_MOVA(Context *ctx)
{
    const int vecsize = vecsize_from_writemask(ctx->dest_arg.writemask);
    char src0[64]; make_METAL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    char code[128];

    ctx->metal_need_header_math = 1;
    ctx->metal_need_header_common = 1;

    if (vecsize == 1)
    {
        make_METAL_destarg_assign(ctx, code, sizeof (code),
                                 "int(floor(abs(%s) + 0.5) * sign(%s))",
                                 src0, src0);
    } // if

    else
    {
        make_METAL_destarg_assign(ctx, code, sizeof (code),
                            "int%d(floor(abs(%s) + float%d(0.5)) * sign(%s))",
                            vecsize, src0, vecsize, src0);
    } // else

    output_line(ctx, "%s", code);
}